

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(Operator *this,OPL3 *OPL3)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint ksr;
  double dVar5;
  
  bVar1 = OPL3->registers[(long)this->operatorBaseAddress + 0x20];
  this->am = (uint)(bVar1 >> 7);
  this->vib = bVar1 >> 6 & 1;
  this->egt = bVar1 >> 5 & 1;
  ksr = bVar1 >> 4 & 1;
  this->ksr = ksr;
  this->mult = bVar1 & 0xf;
  iVar4 = this->f_number;
  dVar5 = (double)__powidf2(0x4000000000000000,this->block + -1);
  (this->phaseGenerator).phaseIncrement =
       (double)iVar4 * 1.9073486328124998e-06 * dVar5 *
       (double)OperatorDataStruct::multTable[bVar1 & 0xf];
  EnvelopeGenerator::setActualAttackRate(&this->envelopeGenerator,this->ar,ksr,this->keyScaleNumber)
  ;
  iVar2 = *(int *)(EnvelopeGeneratorData::rateOffset +
                  (long)this->keyScaleNumber * 4 + (long)this->ksr * 0x40);
  iVar3 = this->rr;
  iVar4 = iVar2 + this->dr * 4;
  if (0x3e < iVar4) {
    iVar4 = 0x3f;
  }
  (this->envelopeGenerator).actualDecayRate = iVar4;
  (this->envelopeGenerator).dBdecayIncrement =
       0.19193871378214752 /
       *(double *)(EnvelopeGeneratorData::decayAndReleaseTimeValuesTable + (long)iVar4 * 0x10 + 8);
  iVar2 = iVar2 + iVar3 * 4;
  iVar4 = 0x3f;
  if (iVar2 < 0x3f) {
    iVar4 = iVar2;
  }
  (this->envelopeGenerator).actualReleaseRate = iVar4;
  (this->envelopeGenerator).dBreleaseIncrement =
       0.19193871378214752 /
       *(double *)(EnvelopeGeneratorData::decayAndReleaseTimeValuesTable + (long)iVar4 * 0x10 + 8);
  return;
}

Assistant:

void Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(OPL3 *OPL3) {
	
	int am1_vib1_egt1_ksr1_mult4 = OPL3->registers[operatorBaseAddress+OperatorDataStruct::AM1_VIB1_EGT1_KSR1_MULT4_Offset];
	
	// Amplitude Modulation. This register is used int EnvelopeGenerator.getEnvelope();
	am  = (am1_vib1_egt1_ksr1_mult4 & 0x80) >> 7;
	// Vibrato. This register is used in PhaseGenerator.getPhase();
	vib = (am1_vib1_egt1_ksr1_mult4 & 0x40) >> 6;
	// Envelope Generator Type. This register is used in EnvelopeGenerator.getEnvelope();
	egt = (am1_vib1_egt1_ksr1_mult4 & 0x20) >> 5;
	// Key Scale Rate. Sets the actual envelope rate together with rate and keyScaleNumber.
	// This register os used in EnvelopeGenerator.setActualAttackRate().
	ksr = (am1_vib1_egt1_ksr1_mult4 & 0x10) >> 4;
	// Multiple. Multiplies the Channel.baseFrequency to get the Operator.operatorFrequency.
	// This register is used in PhaseGenerator.setFrequency().
	mult = am1_vib1_egt1_ksr1_mult4 & 0x0F;
	
	phaseGenerator.setFrequency(f_number, block, mult);
	envelopeGenerator.setActualAttackRate(ar, ksr, keyScaleNumber);
	envelopeGenerator.setActualDecayRate(dr, ksr, keyScaleNumber); 
	envelopeGenerator.setActualReleaseRate(rr, ksr, keyScaleNumber);
}